

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-sve.c
# Opt level: O2

_Bool trans_DOT_zzx(DisasContext_conflict1 *s,arg_DOT_zzx *a)

{
  TCGContext_conflict1 *tcg_ctx;
  undefined1 uVar1;
  
  tcg_ctx = s->uc->tcg_ctx;
  uVar1 = sve_access_check_aarch64(s);
  if ((bool)uVar1) {
    uVar1 = (undefined1)a->index;
    tcg_gen_gvec_3_ool_aarch64
              (tcg_ctx,a->rd * 0x100 + 0xc10,a->rn * 0x100 + 0xc10,a->rm * 0x100 + 0xc10,s->sve_len,
               s->sve_len,a->index,(gen_helper_gvec_3_conflict1 *)trans_DOT_zzx::fns[a->u][a->sz]);
  }
  return (_Bool)uVar1;
}

Assistant:

static bool trans_DOT_zzx(DisasContext *s, arg_DOT_zzx *a)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    static gen_helper_gvec_3 * const fns[2][2] = {
        { gen_helper_gvec_sdot_idx_b, gen_helper_gvec_sdot_idx_h },
        { gen_helper_gvec_udot_idx_b, gen_helper_gvec_udot_idx_h }
    };

    if (sve_access_check(s)) {
        unsigned vsz = vec_full_reg_size(s);
        tcg_gen_gvec_3_ool(tcg_ctx, vec_full_reg_offset(s, a->rd),
                           vec_full_reg_offset(s, a->rn),
                           vec_full_reg_offset(s, a->rm),
                           vsz, vsz, a->index, fns[a->u][a->sz]);
    }
    return true;
}